

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = 0;
  while( true ) {
    if (0x20000 < litLength) {
      __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8049,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
    }
    if (optPtr->priceType == zop_predef) break;
    if (litLength != 0x20000) {
      if (litLength < 0x40) {
        uVar2 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
      }
      else {
        uVar2 = 0x1f;
        if (litLength != 0) {
          for (; litLength >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar2 = (uVar2 ^ 0xffffffe0) + 0x33;
      }
      uVar3 = optPtr->litLengthFreq[uVar2] + 1;
      uVar5 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      if (optLevel == 0) {
        iVar4 = (uVar5 ^ 0x1f) * 0x100 + -0x1f00;
      }
      else {
        if (0x16 < uVar5) goto LAB_001cf6ba;
        iVar4 = -((uVar3 * 0x100 >> ((byte)uVar5 & 0x1f)) + uVar5 * 0x100);
      }
      iVar4 = (uint)""[uVar2] * 0x100 + optPtr->litLengthSumBasePrice + iVar4;
      goto LAB_001cf68e;
    }
    iVar1 = iVar1 + 0x100;
    litLength = 0x1ffff;
  }
  uVar5 = litLength + 1;
  uVar2 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  if (optLevel == 0) {
    iVar4 = uVar2 << 8;
  }
  else {
    if (0x16 < uVar2) {
LAB_001cf6ba:
      __assert_fail("hb + BITCOST_ACCURACY < 31",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7f60,"U32 ZSTD_fracWeight(U32)");
    }
    iVar4 = (uVar5 * 0x100 >> ((byte)uVar2 & 0x1f)) + uVar2 * 0x100;
  }
LAB_001cf68e:
  return iVar4 + iVar1;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}